

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O1

int __thiscall
cmCommandArgumentParserHelper::ParseString(cmCommandArgumentParserHelper *this,char *str,int verb)

{
  char *pcVar1;
  int iVar2;
  yyscan_t in_RAX;
  size_t sVar3;
  ostream *poVar4;
  int iVar5;
  yyscan_t yyscanner;
  yyscan_t local_38;
  
  if (str == (char *)0x0) {
    iVar5 = 0;
  }
  else {
    this->Verbose = verb;
    pcVar1 = (char *)(this->InputBuffer)._M_string_length;
    local_38 = in_RAX;
    strlen(str);
    iVar5 = 0;
    std::__cxx11::string::_M_replace((ulong)&this->InputBuffer,0,pcVar1,(ulong)str);
    this->InputBufferPos = 0;
    this->CurrentLine = 0;
    std::__cxx11::string::_M_replace
              ((ulong)&this->Result,0,(char *)(this->Result)._M_string_length,0x59b99e);
    cmCommandArgument_yylex_init(&local_38);
    cmCommandArgument_yyset_extra(this,local_38);
    cmCommandArgument_SetupEscapes(local_38,this->NoEscapeMode);
    iVar2 = cmCommandArgument_yyparse(local_38);
    cmCommandArgument_yylex_destroy(local_38);
    if (iVar2 == 0) {
      CleanupParser(this);
      iVar5 = 1;
      if (this->Verbose != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Expanding [",0xb);
        sVar3 = strlen(str);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,str,sVar3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"] produced: [",0xd);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(this->Result)._M_dataplus._M_p,
                            (this->Result)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
        std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
      }
    }
  }
  return iVar5;
}

Assistant:

int cmCommandArgumentParserHelper::ParseString(const char* str, int verb)
{
  if (!str) {
    return 0;
  }
  this->Verbose = verb;
  this->InputBuffer = str;
  this->InputBufferPos = 0;
  this->CurrentLine = 0;

  this->Result = "";

  yyscan_t yyscanner;
  cmCommandArgument_yylex_init(&yyscanner);
  cmCommandArgument_yyset_extra(this, yyscanner);
  cmCommandArgument_SetupEscapes(yyscanner, this->NoEscapeMode);
  int res = cmCommandArgument_yyparse(yyscanner);
  cmCommandArgument_yylex_destroy(yyscanner);
  if (res != 0) {
    return 0;
  }

  this->CleanupParser();

  if (Verbose) {
    std::cerr << "Expanding [" << str << "] produced: [" << this->Result << "]"
              << std::endl;
  }
  return 1;
}